

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoinsMinConf
          (CoinSelection *this,int64_t *target_value,
          vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *utxos,UtxoFilter *filter,
          CoinSelectionOption *option_params,Amount *tx_fee_value,bool consider_fee,
          int64_t *select_value,Amount *utxo_fee_value,bool *searched_bnb)

{
  byte bVar1;
  bool bVar2;
  uint64_t uVar3;
  int64_t iVar4;
  int64_t iVar5;
  CfdException *this_00;
  string *message;
  undefined8 in_RCX;
  Amount *in_RDX;
  byte *in_RSI;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  CoinSelection *in_R8;
  CoinSelectionOption *in_R9;
  Amount AVar6;
  int64_t *unaff_retaddr;
  CoinSelection *in_stack_00000008;
  byte in_stack_00000010;
  CfdSourceLocation *in_stack_00000018;
  value_type *in_stack_00000020;
  int64_t *in_stack_00000028;
  Amount *in_stack_00000030;
  int64_t need_value;
  int64_t find_value;
  int64_t opt_min_change;
  uint64_t min_change;
  Amount utxo_fee;
  int64_t search_value;
  Utxo **utxo_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *__range2_1;
  uint64_t effective_value;
  uint64_t fee;
  Utxo **utxo;
  iterator __end2;
  iterator __begin2;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *__range2;
  FeeCalculator long_term_fee;
  bool ignore_error;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> utxo_pool;
  bool use_fee;
  Amount cost_of_change;
  FeeCalculator discard_fee;
  FeeCalculator effective_fee;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> work_utxos;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *result;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *in_stack_fffffffffffffc58;
  Amount *args_1;
  CfdSourceLocation *in_stack_fffffffffffffc60;
  value_type *in_stack_fffffffffffffc68;
  CfdSourceLocation *in_stack_fffffffffffffc70;
  Utxo *in_stack_fffffffffffffc78;
  allocator *paVar7;
  FeeCalculator *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  uint32_t size;
  FeeCalculator *in_stack_fffffffffffffc90;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  uint64_t local_340;
  allocator local_281;
  string local_280 [32];
  char *local_260;
  undefined4 local_258;
  char *local_250;
  exception *local_248;
  char *local_240;
  undefined1 local_231;
  int64_t local_230;
  int64_t local_228;
  value_type local_220;
  undefined1 local_218;
  Amount local_210;
  long local_200;
  int64_t local_1f8;
  undefined1 local_1f0;
  Amount local_1e8;
  reference local_1d8;
  Utxo **local_1d0;
  __normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_> local_1c8
  ;
  undefined1 *local_1c0;
  int local_1b4;
  int64_t local_1b0;
  byte local_1a1;
  int64_t local_1a0;
  undefined1 local_198;
  Amount local_190;
  uint64_t local_180;
  int64_t local_178;
  undefined1 local_170;
  Amount local_168;
  ulong local_158;
  reference local_150;
  Utxo **local_148;
  __normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_> local_140
  ;
  undefined1 *local_138;
  FeeCalculator local_130;
  byte local_129;
  int64_t local_110;
  undefined1 local_108;
  int64_t local_100;
  undefined1 local_f8;
  Amount local_f0;
  int64_t local_e0;
  undefined1 local_d8;
  Amount local_d0;
  int64_t local_c0;
  undefined1 local_b8;
  byte local_a9;
  int64_t local_a8;
  undefined1 local_a0;
  Amount local_98;
  FeeCalculator local_88 [4];
  int64_t *in_stack_ffffffffffffff88;
  uint64_t in_stack_ffffffffffffff90;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *in_stack_ffffffffffffff98;
  int64_t *in_stack_ffffffffffffffa0;
  CoinSelection *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffc0;
  undefined1 ignore_error_00;
  byte *pbVar8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *pvVar9;
  
  size = (uint32_t)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  bVar1 = in_stack_00000010 & 1;
  pbVar8 = in_RSI;
  pvVar9 = in_RDI;
  if (in_stack_00000018 == (CfdSourceLocation *)0x0) {
    strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
            ,0x2f);
    in_stack_ffffffffffffffc0 = "SelectCoinsMinConf";
    core::logger::info<void_const*>
              (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,(void **)0x52d1a9);
  }
  else {
    in_stack_00000018->filename = (char *)0x0;
    in_R8 = in_stack_ffffffffffffffa8;
  }
  if (in_stack_00000028 != (int64_t *)0x0) {
    *(undefined1 *)in_stack_00000028 = 0;
  }
  std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::vector
            ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)
             CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),in_stack_fffffffffffffca8
            );
  uVar3 = CoinSelectionOption::GetEffectiveFeeBaserate(in_R9);
  FeeCalculator::FeeCalculator((FeeCalculator *)&stack0xffffffffffffff8c,uVar3);
  FeeCalculator::FeeCalculator(local_88,10000);
  AVar6 = core::Amount::CreateBySatoshiAmount(0);
  local_a8 = AVar6.amount_;
  local_a0 = AVar6.ignore_check_;
  local_a9 = 0;
  local_98.amount_ = local_a8;
  local_98.ignore_check_ = (bool)local_a0;
  uVar3 = CoinSelectionOption::GetEffectiveFeeBaserate(in_R9);
  if (uVar3 != 0) {
    CoinSelectionOption::GetChangeSpendSize(in_R9);
    AVar6 = FeeCalculator::GetFee(in_stack_fffffffffffffc90,size);
    local_e0 = AVar6.amount_;
    local_d8 = AVar6.ignore_check_;
    local_d0.amount_ = local_e0;
    local_d0.ignore_check_ = (bool)local_d8;
    CoinSelectionOption::GetChangeOutputSize(in_R9);
    AVar6 = FeeCalculator::GetFee(in_stack_fffffffffffffc90,size);
    local_100 = AVar6.amount_;
    local_f8 = AVar6.ignore_check_;
    local_f0.amount_ = local_100;
    local_f0.ignore_check_ = (bool)local_f8;
    AVar6 = core::operator+(&local_d0,&local_f0);
    local_110 = AVar6.amount_;
    local_108 = AVar6.ignore_check_;
    local_a9 = 1;
    local_c0 = local_110;
    local_b8 = local_108;
    local_98.amount_ = local_110;
    local_98.ignore_check_ = (bool)local_108;
  }
  std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::vector
            ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)0x52d3fe);
  local_129 = 0;
  if (((*in_RSI & 1) != 0) && (bVar2 = CoinSelectionOption::IsUseBnB(in_R9), bVar2)) {
    uVar3 = CoinSelectionOption::GetLongTermFeeBaserate(in_R9);
    FeeCalculator::FeeCalculator(&local_130,uVar3);
    local_138 = &stack0xffffffffffffff90;
    local_140._M_current =
         (Utxo **)std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::begin
                            (in_stack_fffffffffffffc58);
    local_148 = (Utxo **)std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::end
                                   (in_stack_fffffffffffffc58);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>
                          *)in_stack_fffffffffffffc60,
                         (__normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>
                          *)in_stack_fffffffffffffc58);
      ignore_error_00 = (undefined1)((ulong)in_RCX >> 0x38);
      if (!bVar2) break;
      local_150 = __gnu_cxx::
                  __normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>
                  ::operator*(&local_140);
      if (*local_150 != (Utxo *)0x0) {
        (*local_150)->fee = 0;
        (*local_150)->long_term_fee = 0;
        (*local_150)->effective_value = 0;
        AVar6 = FeeCalculator::GetFee(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        local_178 = AVar6.amount_;
        local_170 = AVar6.ignore_check_;
        local_168.amount_ = local_178;
        local_168.ignore_check_ = (bool)local_170;
        local_158 = core::Amount::GetSatoshiValue(&local_168);
        if ((local_158 < (*local_150)->amount) || (bVar1 == 0)) {
          local_180 = (*local_150)->amount;
          if ((local_a9 & 1) != 0) {
            if (bVar1 != 0) {
              local_180 = local_180 - local_158;
            }
            (*local_150)->fee = local_158;
            AVar6 = FeeCalculator::GetFee(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
            local_1a0 = AVar6.amount_;
            local_198 = AVar6.ignore_check_;
            local_190.amount_ = local_1a0;
            local_190.ignore_check_ = (bool)local_198;
            uVar3 = core::Amount::GetSatoshiValue(&local_190);
            (*local_150)->long_term_fee = uVar3;
          }
          if ((*local_150)->fee < (*local_150)->long_term_fee) {
            (*local_150)->long_term_fee = (*local_150)->fee;
          }
          (*local_150)->effective_value = local_180;
          (*local_150)->effective_k_value = local_180;
          std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::push_back
                    ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)in_stack_fffffffffffffc70,
                     in_stack_fffffffffffffc68);
        }
        else {
          local_129 = 1;
        }
      }
      __gnu_cxx::
      __normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>::
      operator++(&local_140);
    }
    local_1a1 = 0;
    local_1b0 = core::Amount::GetSatoshiValue(&local_98);
    in_stack_fffffffffffffc58 =
         (vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)
         (CONCAT44((int)((ulong)in_stack_fffffffffffffc58 >> 0x20),(uint)local_129) &
         0xffffffff00000001);
    in_stack_fffffffffffffc60 = in_stack_00000018;
    in_stack_fffffffffffffc68 = in_stack_00000020;
    SelectCoinsBnB(in_stack_00000008,unaff_retaddr,
                   (vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)pvVar9,(int64_t *)pbVar8,
                   in_RDX,(bool)ignore_error_00,in_stack_00000028,in_stack_00000030);
    bVar2 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::empty
                      ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffc70);
    if (bVar2) {
      local_1b4 = 0;
    }
    else {
      if (in_stack_00000028 != (int64_t *)0x0) {
        *(undefined1 *)in_stack_00000028 = 1;
      }
      local_1a1 = 1;
      local_1b4 = 1;
    }
    if ((local_1a1 & 1) == 0) {
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffc70);
    }
    if (local_1b4 != 0) goto LAB_0052de3b;
  }
  bVar2 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::empty
                    ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)in_stack_fffffffffffffc70)
  ;
  if ((bVar2) || ((local_129 & 1) != 0)) {
    std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::clear
              ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)0x52d8c8);
    local_1c0 = &stack0xffffffffffffff90;
    local_1c8._M_current =
         (Utxo **)std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::begin
                            (in_stack_fffffffffffffc58);
    local_1d0 = (Utxo **)std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::end
                                   (in_stack_fffffffffffffc58);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>
                               *)in_stack_fffffffffffffc60,
                              (__normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>
                               *)in_stack_fffffffffffffc58), bVar2) {
      local_1d8 = __gnu_cxx::
                  __normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>
                  ::operator*(&local_1c8);
      if (*local_1d8 != (Utxo *)0x0) {
        if ((local_a9 & 1) == 0) {
          local_340 = 0;
        }
        else {
          AVar6 = FeeCalculator::GetFee(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          local_1f8 = AVar6.amount_;
          local_1f0 = AVar6.ignore_check_;
          local_1e8.amount_ = local_1f8;
          local_1e8.ignore_check_ = (bool)local_1f0;
          local_340 = core::Amount::GetSatoshiValue(&local_1e8);
        }
        (*local_1d8)->fee = local_340;
        (*local_1d8)->effective_k_value = (*local_1d8)->amount;
        if (bVar1 != 0) {
          (*local_1d8)->effective_k_value = (*local_1d8)->effective_k_value - (*local_1d8)->fee;
        }
        std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::push_back
                  ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)in_stack_fffffffffffffc70,
                   in_stack_fffffffffffffc68);
      }
      __gnu_cxx::
      __normal_iterator<cfd::Utxo_**,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>::
      operator++(&local_1c8);
    }
  }
  local_200 = in_RDX->amount_;
  AVar6 = core::Amount::CreateBySatoshiAmount(0);
  local_220 = (value_type)AVar6.amount_;
  local_218 = AVar6.ignore_check_;
  local_210.amount_ = (int64_t)local_220;
  local_210.ignore_check_ = (bool)local_218;
  iVar4 = core::Amount::GetSatoshiValue((Amount *)in_stack_00000008);
  if (0 < iVar4) {
    iVar4 = core::Amount::GetSatoshiValue((Amount *)in_stack_00000008);
    local_200 = iVar4 + local_200;
  }
  local_228 = 1000000;
  iVar4 = CoinSelectionOption::GetKnapsackMinimumChange(in_R9);
  local_230 = iVar4;
  if (-1 < iVar4) {
    if (((local_a9 & 1) == 0) || (iVar5 = core::Amount::GetSatoshiValue(&local_98), iVar5 < iVar4))
    {
      local_228 = local_230;
    }
    else if ((local_a9 & 1) != 0) {
      local_228 = core::Amount::GetSatoshiValue(&local_98);
    }
  }
  local_231 = 0;
  args_1 = &local_210;
  KnapsackSolver(in_R8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
                 ,in_stack_ffffffffffffff88,(Amount *)in_stack_ffffffffffffffc0);
  if ((local_a9 & 1) != 0) {
    local_240 = in_stack_00000018->filename;
    local_248 = (exception *)local_200;
    this_00 = (CfdException *)core::Amount::GetSatoshiValue(&local_210);
    local_248 = &this_00->super_exception + (long)local_248;
    if ((long)local_240 < (long)local_248) {
      local_260 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
                          ,0x2f);
      local_260 = local_260 + 1;
      local_258 = 0x243;
      local_250 = "SelectCoinsMinConf";
      core::logger::warn<long&,long&>
                (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68,
                 (long *)in_stack_fffffffffffffc60,&args_1->amount_);
      message = (string *)__cxa_allocate_exception(0x30);
      paVar7 = &local_281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"Failed to KnapsackSolver. Not enough utxos.",paVar7);
      core::CfdException::CfdException(this_00,(CfdError)((ulong)paVar7 >> 0x20),message);
      __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  if (in_stack_00000020 != (value_type *)0x0) {
    *in_stack_00000020 = (value_type)local_210.amount_;
    *(bool *)(in_stack_00000020 + 1) = local_210.ignore_check_;
  }
  local_1b4 = 1;
  local_231 = 1;
LAB_0052de3b:
  std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::~vector
            ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)in_stack_fffffffffffffc70);
  std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::~vector
            ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)in_stack_fffffffffffffc70);
  return in_RDI;
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoinsMinConf(
    const int64_t& target_value, const std::vector<Utxo*>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, const bool consider_fee, int64_t* select_value,
    Amount* utxo_fee_value, bool* searched_bnb) {
  // for btc default(DUST_RELAY_TX_FEE(3000)) -> DEFAULT_DISCARD_FEE(10000)
  if (select_value != nullptr) {
    *select_value = 0;
  } else {
    cfd::core::logger::info(
        CFD_LOG_SOURCE, "select_value=null, filter={}",
        static_cast<const void*>(&filter));
    // for unused parameter
  }
  if (searched_bnb != nullptr) *searched_bnb = false;

  // Copy the list to change the calculation area.
  std::vector<Utxo*> work_utxos = utxos;
  FeeCalculator effective_fee(option_params.GetEffectiveFeeBaserate());
  FeeCalculator discard_fee(kDefaultDiscardFee);
  Amount cost_of_change = Amount::CreateBySatoshiAmount(0);
  bool use_fee = false;
  if (option_params.GetEffectiveFeeBaserate() != 0) {
    cost_of_change = discard_fee.GetFee(option_params.GetChangeSpendSize()) +
                     effective_fee.GetFee(option_params.GetChangeOutputSize());
    use_fee = true;
  }

  std::vector<Utxo*> utxo_pool;
  bool ignore_error = false;
  if (use_bnb_ && option_params.IsUseBnB()) {
    // Get long term estimate
    FeeCalculator long_term_fee(option_params.GetLongTermFeeBaserate());

    // NOLINT Filter by the min conf specs and add to utxo_pool and calculate effective value
    for (auto& utxo : work_utxos) {
      if (utxo == nullptr) continue;
      // if (!group.EligibleForSpending(eligibility_filter)) continue;
      utxo->fee = 0;
      utxo->long_term_fee = 0;
      utxo->effective_value = 0;

      uint64_t fee = effective_fee.GetFee(*utxo).GetSatoshiValue();
      // Only include outputs that are positive effective value (i.e. not dust)
      if ((utxo->amount > fee) || (!consider_fee)) {
        uint64_t effective_value = utxo->amount;
        if (use_fee) {
          if (consider_fee) {
            effective_value -= fee;
          }
          utxo->fee = fee;
          utxo->long_term_fee = long_term_fee.GetFee(*utxo).GetSatoshiValue();
        }
#if 0
        std::vector<uint8_t> txid_byte(sizeof(utxo->txid));
        memcpy(txid_byte.data(), utxo->txid, txid_byte.size());
        info(
            CFD_LOG_SOURCE, "utxo({},{}) size={}/{} amount={}/{}/{}",
            Txid(txid_byte).GetHex(), utxo->vout, utxo->uscript_size_max,
            utxo->witness_size_max, utxo->amount, utxo->fee,
            utxo->long_term_fee);
#endif
        if (utxo->long_term_fee > utxo->fee) {
          utxo->long_term_fee = utxo->fee;  // TODO(k-matsuzawa): Check later
        }
        utxo->effective_value = effective_value;
        utxo->effective_k_value = static_cast<int64_t>(effective_value);
        utxo_pool.push_back(utxo);
      } else {
        ignore_error = true;
      }
    }
    // Calculate the fees for things that aren't inputs
    std::vector<Utxo> result = SelectCoinsBnB(
        target_value, utxo_pool, cost_of_change.GetSatoshiValue(),
        tx_fee_value, ignore_error, select_value, utxo_fee_value);
    if (!result.empty()) {
      if (searched_bnb) *searched_bnb = true;
      return result;
    }
    // SelectCoinsBnB fail, go to KnapsackSolver.
  }

  // Filter by the min conf specs and add to utxo_pool
  // TODO(k-matsuzawa): Currently it is not filtered, so there is no need to recreate the Utxo list.  // NOLINT
  // for (const OutputGroup& group : groups) {
  //   if (!group.EligibleForSpending(eligibility_filter)) continue;
  //   utxo_pool.push_back(group);
  // }
  if (utxo_pool.empty() || ignore_error) {
    utxo_pool.clear();
    for (auto& utxo : work_utxos) {
      if (utxo == nullptr) continue;
      utxo->fee =
          (use_fee) ? effective_fee.GetFee(*utxo).GetSatoshiValue() : 0;
      utxo->effective_k_value = static_cast<int64_t>(utxo->amount);
      if (consider_fee) {
        utxo->effective_k_value -= static_cast<int64_t>(utxo->fee);
      }
      utxo_pool.push_back(utxo);
    }
  }
  int64_t search_value = target_value;
  Amount utxo_fee = Amount::CreateBySatoshiAmount(0);
  if (tx_fee_value.GetSatoshiValue() > 0) {
    search_value += tx_fee_value.GetSatoshiValue();
  }

  // using minimum fee
  uint64_t min_change = kMinChange;
  int64_t opt_min_change = option_params.GetKnapsackMinimumChange();
  if (opt_min_change >= 0) {
    if ((!use_fee) || (opt_min_change > cost_of_change.GetSatoshiValue())) {
      min_change = static_cast<uint64_t>(opt_min_change);
    } else if (use_fee) {
      min_change = static_cast<uint64_t>(cost_of_change.GetSatoshiValue());
    }
  }
  std::vector<Utxo> result = KnapsackSolver(
      search_value, utxo_pool, min_change, select_value, &utxo_fee);
  if (use_fee) {
    // Check if the required amount was detected
    // (May be a non-passing route)
    int64_t find_value = *select_value;
    int64_t need_value = search_value;
    need_value += utxo_fee.GetSatoshiValue();
    if (need_value > find_value) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to KnapsackSolver. Not enough utxos."
          ": find_value={}, need_value={}",
          find_value, need_value);
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to KnapsackSolver. Not enough utxos.");
    }
  }
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = utxo_fee;
  }
  return result;
}